

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O0

void __thiscall
gl4cts::GPUShaderFP64Test3::prepareProgram
          (GPUShaderFP64Test3 *this,programInfo *program_info,uniformDataLayout uniform_data_layout)

{
  Context *ctx;
  programInfo *this_00;
  string local_890 [32];
  string local_870 [32];
  string local_850 [32];
  string local_830 [32];
  string local_810 [32];
  vector<gl4cts::GPUShaderFP64Test3::uniformDetails,_std::allocator<gl4cts::GPUShaderFP64Test3::uniformDetails>_>
  local_7f0;
  stringstream local_7d8 [8];
  stringstream vertex_shader_code;
  ostream local_7c8;
  stringstream local_650 [8];
  stringstream tess_eval_shader_code;
  ostream local_640;
  stringstream local_4c8 [8];
  stringstream tess_control_shader_code;
  ostream local_4b8;
  stringstream local_330 [8];
  stringstream geometry_shader_code;
  ostream local_320;
  stringstream local_1a8 [8];
  stringstream fragment_shader_code;
  ostream local_198;
  uniformDataLayout local_1c;
  programInfo *ppStack_18;
  uniformDataLayout uniform_data_layout_local;
  programInfo *program_info_local;
  GPUShaderFP64Test3 *this_local;
  
  local_1c = uniform_data_layout;
  ppStack_18 = program_info;
  program_info_local = (programInfo *)this;
  std::__cxx11::stringstream::stringstream(local_1a8);
  std::__cxx11::stringstream::stringstream(local_330);
  std::__cxx11::stringstream::stringstream(local_4c8);
  std::__cxx11::stringstream::stringstream(local_650);
  std::__cxx11::stringstream::stringstream(local_7d8);
  writePreamble(this,&local_198,FRAGMENT_SHADER);
  writePreamble(this,&local_320,GEOMETRY_SHADER);
  writePreamble(this,&local_4b8,TESS_CONTROL_SHADER);
  writePreamble(this,&local_640,TESS_EVAL_SHADER);
  writePreamble(this,&local_7c8,VERTEX_SHADER);
  writeUniformBlock(this,&local_198,local_1c);
  writeUniformBlock(this,&local_320,local_1c);
  writeUniformBlock(this,&local_4b8,local_1c);
  writeUniformBlock(this,&local_640,local_1c);
  writeUniformBlock(this,&local_7c8,local_1c);
  writeVaryingDeclarations(this,&local_198,FRAGMENT_SHADER);
  writeVaryingDeclarations(this,&local_320,GEOMETRY_SHADER);
  writeVaryingDeclarations(this,&local_4b8,TESS_CONTROL_SHADER);
  writeVaryingDeclarations(this,&local_640,TESS_EVAL_SHADER);
  writeVaryingDeclarations(this,&local_7c8,VERTEX_SHADER);
  writeMainBody(this,&local_198,FRAGMENT_SHADER);
  writeMainBody(this,&local_320,GEOMETRY_SHADER);
  writeMainBody(this,&local_4b8,TESS_CONTROL_SHADER);
  writeMainBody(this,&local_640,TESS_EVAL_SHADER);
  writeMainBody(this,&local_7c8,VERTEX_SHADER);
  this_00 = ppStack_18;
  ctx = (this->super_TestCase).m_context;
  std::
  vector<gl4cts::GPUShaderFP64Test3::uniformDetails,_std::allocator<gl4cts::GPUShaderFP64Test3::uniformDetails>_>
  ::vector(&local_7f0,&this->m_uniform_details);
  std::__cxx11::stringstream::str();
  std::__cxx11::string::c_str();
  std::__cxx11::stringstream::str();
  std::__cxx11::string::c_str();
  std::__cxx11::stringstream::str();
  std::__cxx11::string::c_str();
  std::__cxx11::stringstream::str();
  std::__cxx11::string::c_str();
  std::__cxx11::stringstream::str();
  std::__cxx11::string::c_str();
  programInfo::init(this_00,(EVP_PKEY_CTX *)ctx);
  std::__cxx11::string::~string(local_890);
  std::__cxx11::string::~string(local_870);
  std::__cxx11::string::~string(local_850);
  std::__cxx11::string::~string(local_830);
  std::__cxx11::string::~string(local_810);
  std::
  vector<gl4cts::GPUShaderFP64Test3::uniformDetails,_std::allocator<gl4cts::GPUShaderFP64Test3::uniformDetails>_>
  ::~vector(&local_7f0);
  std::__cxx11::stringstream::~stringstream(local_7d8);
  std::__cxx11::stringstream::~stringstream(local_650);
  std::__cxx11::stringstream::~stringstream(local_4c8);
  std::__cxx11::stringstream::~stringstream(local_330);
  std::__cxx11::stringstream::~stringstream(local_1a8);
  return;
}

Assistant:

void GPUShaderFP64Test3::prepareProgram(programInfo& program_info, uniformDataLayout uniform_data_layout) const
{
	/* Storage for shader source code */
	std::stringstream fragment_shader_code;
	std::stringstream geometry_shader_code;
	std::stringstream tess_control_shader_code;
	std::stringstream tess_eval_shader_code;
	std::stringstream vertex_shader_code;

	/* Write preambles */
	writePreamble(fragment_shader_code, FRAGMENT_SHADER);
	writePreamble(geometry_shader_code, GEOMETRY_SHADER);
	writePreamble(tess_control_shader_code, TESS_CONTROL_SHADER);
	writePreamble(tess_eval_shader_code, TESS_EVAL_SHADER);
	writePreamble(vertex_shader_code, VERTEX_SHADER);

	/* Write definition of named uniform block */
	writeUniformBlock(fragment_shader_code, uniform_data_layout);
	writeUniformBlock(geometry_shader_code, uniform_data_layout);
	writeUniformBlock(tess_control_shader_code, uniform_data_layout);
	writeUniformBlock(tess_eval_shader_code, uniform_data_layout);
	writeUniformBlock(vertex_shader_code, uniform_data_layout);

	/* Write definitions of varyings */
	writeVaryingDeclarations(fragment_shader_code, FRAGMENT_SHADER);
	writeVaryingDeclarations(geometry_shader_code, GEOMETRY_SHADER);
	writeVaryingDeclarations(tess_control_shader_code, TESS_CONTROL_SHADER);
	writeVaryingDeclarations(tess_eval_shader_code, TESS_EVAL_SHADER);
	writeVaryingDeclarations(vertex_shader_code, VERTEX_SHADER);

	/* Write main routine */
	writeMainBody(fragment_shader_code, FRAGMENT_SHADER);
	writeMainBody(geometry_shader_code, GEOMETRY_SHADER);
	writeMainBody(tess_control_shader_code, TESS_CONTROL_SHADER);
	writeMainBody(tess_eval_shader_code, TESS_EVAL_SHADER);
	writeMainBody(vertex_shader_code, VERTEX_SHADER);

	/* Init programInfo instance */
	program_info.init(m_context, m_uniform_details, fragment_shader_code.str().c_str(),
					  geometry_shader_code.str().c_str(), tess_control_shader_code.str().c_str(),
					  tess_eval_shader_code.str().c_str(), vertex_shader_code.str().c_str());
}